

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests-file_reading.c
# Opt level: O0

greatest_test_res fr_frequencies(void)

{
  int iVar1;
  FILE *__stream;
  undefined1 local_418 [8];
  frequency_t expected [11];
  int record_count;
  frequency_t *records;
  FILE *fp;
  
  __stream = fopen("../tests/data/google_sample/frequencies.txt","r");
  if (__stream == (FILE *)0x0) {
    greatest_info.fail_file =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/4rterius[P]cgtfs/tests/tests-file_reading.c"
    ;
    greatest_info.fail_line = 200;
    greatest_info.msg = "Couldn\'t open `data/google_sample/frequencies.txt` test file";
    if ((greatest_info.flags & 4) != 0) {
      abort();
    }
    fp._4_4_ = GREATEST_TEST_RES_FAIL;
  }
  else {
    expected[10].headway_secs =
         read_all_frequencies((FILE *)__stream,(frequency_t **)&expected[10].exact_times);
    greatest_info.assertions = greatest_info.assertions + 1;
    if (expected[10].headway_secs == 0xb) {
      memcpy(local_418,&DAT_00243f70,0x3f4);
      greatest_info.assertions = greatest_info.assertions + 1;
      iVar1 = equal_frequency((frequency_t *)local_418,stack0xffffffffffffffe0);
      if (iVar1 == 0) {
        greatest_info.fail_file =
             "/workspace/llm4binary/github/license_all_cmakelists_1510/4rterius[P]cgtfs/tests/tests-file_reading.c"
        ;
        greatest_info.fail_line = 0xe4;
        greatest_info.msg = "equal_frequency(&(expected[0]), &(records[0]))";
        if ((greatest_info.flags & 4) != 0) {
          abort();
        }
        fp._4_4_ = GREATEST_TEST_RES_FAIL;
      }
      else {
        greatest_info.assertions = greatest_info.assertions + 1;
        iVar1 = equal_frequency((frequency_t *)&expected[0].headway_secs,stack0xffffffffffffffe0 + 1
                               );
        if (iVar1 == 0) {
          greatest_info.fail_file =
               "/workspace/llm4binary/github/license_all_cmakelists_1510/4rterius[P]cgtfs/tests/tests-file_reading.c"
          ;
          greatest_info.fail_line = 0xe5;
          greatest_info.msg = "equal_frequency(&(expected[1]), &(records[1]))";
          if ((greatest_info.flags & 4) != 0) {
            abort();
          }
          fp._4_4_ = GREATEST_TEST_RES_FAIL;
        }
        else {
          greatest_info.assertions = greatest_info.assertions + 1;
          iVar1 = equal_frequency((frequency_t *)&expected[1].headway_secs,
                                  stack0xffffffffffffffe0 + 2);
          if (iVar1 == 0) {
            greatest_info.fail_file =
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/4rterius[P]cgtfs/tests/tests-file_reading.c"
            ;
            greatest_info.fail_line = 0xe6;
            greatest_info.msg = "equal_frequency(&(expected[2]), &(records[2]))";
            if ((greatest_info.flags & 4) != 0) {
              abort();
            }
            fp._4_4_ = GREATEST_TEST_RES_FAIL;
          }
          else {
            if (0 < expected[10].headway_secs) {
              free(stack0xffffffffffffffe0);
            }
            if (__stream != (FILE *)0x0) {
              fclose(__stream);
            }
            greatest_info.msg = (char *)0x0;
            fp._4_4_ = GREATEST_TEST_RES_PASS;
          }
        }
      }
    }
    else {
      greatest_info.fail_file =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/4rterius[P]cgtfs/tests/tests-file_reading.c"
      ;
      greatest_info.fail_line = 0xcd;
      greatest_info.msg = "11 != record_count";
      if ((greatest_info.flags & 4) != 0) {
        abort();
      }
      fp._4_4_ = GREATEST_TEST_RES_FAIL;
    }
  }
  return fp._4_4_;
}

Assistant:

TEST fr_frequencies(void) {
    FILE *fp = fopen("../tests/data/google_sample/frequencies.txt", "r");
    if (fp == NULL) {
        FAILm("Couldn't open `data/google_sample/frequencies.txt` test file");
    } else {
        frequency_t *records;
        int record_count = read_all_frequencies(fp, &records);

        ASSERT_EQ(11, record_count);

        frequency_t expected[11] = {
            {
                .trip_id = "STBA",
                .start_time = "6:00:00",
                .end_time = "22:00:00",
                .headway_secs = 1800
            },
            {
                .trip_id = "CITY1",
                .start_time = "6:00:00",
                .end_time = "7:59:59",
                .headway_secs = 1800
            },
            {
                .trip_id = "CITY2",
                .start_time = "6:00:00",
                .end_time = "7:59:59",
                .headway_secs = 1800
            }
        };

        ASSERT(equal_frequency(&(expected[0]), &(records[0])));
        ASSERT(equal_frequency(&(expected[1]), &(records[1])));
        ASSERT(equal_frequency(&(expected[2]), &(records[2])));

        if (record_count > 0) free(records);
        if (fp) fclose(fp);
    }
    PASS();
}